

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_prepare_import_ec_key
          (psa_ecc_curve_t curve,size_t data_length,int is_public,mbedtls_ecp_keypair **p_ecp)

{
  mbedtls_ecp_group_id id;
  int ret;
  psa_status_t pVar1;
  mbedtls_ecp_keypair *key;
  
  key = (mbedtls_ecp_keypair *)calloc(1,0x158);
  *p_ecp = key;
  if (key == (mbedtls_ecp_keypair *)0x0) {
    pVar1 = -0x8d;
  }
  else {
    mbedtls_ecp_keypair_init(key);
    if (is_public != 0) {
      if ((data_length & 1) == 0) {
        return -0x87;
      }
      data_length = data_length >> 1;
    }
    id = mbedtls_ecc_group_of_psa(curve,data_length);
    if (id != MBEDTLS_ECP_DP_NONE) {
      ret = mbedtls_ecp_group_load(&(*p_ecp)->grp,id);
      pVar1 = mbedtls_to_psa_error(ret);
      return pVar1;
    }
    pVar1 = -0x87;
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_prepare_import_ec_key( psa_ecc_curve_t curve,
                                               size_t data_length,
                                               int is_public,
                                               mbedtls_ecp_keypair **p_ecp )
{
    mbedtls_ecp_group_id grp_id = MBEDTLS_ECP_DP_NONE;
    *p_ecp = mbedtls_calloc( 1, sizeof( mbedtls_ecp_keypair ) );
    if( *p_ecp == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );
    mbedtls_ecp_keypair_init( *p_ecp );

    if( is_public )
    {
        /* A public key is represented as:
         * - The byte 0x04;
         * - `x_P` as a `ceiling(m/8)`-byte string, big-endian;
         * - `y_P` as a `ceiling(m/8)`-byte string, big-endian.
         * So its data length is 2m+1 where n is the key size in bits.
         */
        if( ( data_length & 1 ) == 0 )
            return( PSA_ERROR_INVALID_ARGUMENT );
        data_length = data_length / 2;
    }

    /* Load the group. */
    grp_id = mbedtls_ecc_group_of_psa( curve, data_length );
    if( grp_id == MBEDTLS_ECP_DP_NONE )
        return( PSA_ERROR_INVALID_ARGUMENT );
    return( mbedtls_to_psa_error(
                mbedtls_ecp_group_load( &( *p_ecp )->grp, grp_id ) ) );
}